

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir_Resampler.cpp
# Opt level: O0

blargg_err_t __thiscall Fir_Resampler_::buffer_size(Fir_Resampler_ *this,int new_size)

{
  undefined4 in_ESI;
  blargg_err_t blargg_return_err_;
  size_t in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  local_8 = blargg_vector<short>::resize
                      ((blargg_vector<short> *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                       in_stack_ffffffffffffffe0);
  if (local_8 == (blargg_err_t)0x0) {
    clear((Fir_Resampler_ *)0x0);
    local_8 = (blargg_err_t)0x0;
  }
  return local_8;
}

Assistant:

blargg_err_t Fir_Resampler_::buffer_size( int new_size )
{
	RETURN_ERR( buf.resize( new_size + write_offset ) );
	clear();
	return 0;
}